

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O2

YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)

{
  int iVar1;
  R_conflict4 RVar2;
  R_conflict4 RVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  YearMonthDay YVar7;
  R_conflict3 RVar8;
  
  RVar8 = QRoundingDown::qDivMod<146097U,_long_long,_true>(jd * 4 + -0x690c7d);
  iVar5 = ((int)jd + -0x1a431f) - (int)((ulong)(RVar8.quotient * 0x23ab1) >> 2);
  RVar2 = QRoundingDown::qDivMod<1461U,_int,_true>(iVar5 * 4 + -1);
  iVar5 = iVar5 - ((uint)(RVar2.quotient * 0x5b5) >> 2);
  RVar3 = QRoundingDown::qDivMod<153U,_int,_true>(iVar5 * 5 + -3);
  iVar1 = RVar3.quotient;
  iVar6 = iVar1 + -0xc;
  if (iVar1 < 10) {
    iVar6 = iVar1;
  }
  iVar4 = (uint)(9 < iVar1) + (int)RVar8.quotient * 100 + RVar2.quotient;
  YVar7.month = iVar6 + 3;
  YVar7.year = iVar4 - (uint)(iVar4 < 1);
  YVar7.day = iVar5 - (iVar1 * 0x99 + 2U) / 5;
  return YVar7;
}

Assistant:

QCalendar::YearMonthDay QGregorianCalendar::partsFromJulian(qint64 jd)
{
    const qint64 dayNumber = jd - BaseJd;
    const qint64 century = qDiv<FourCenturies>(4 * dayNumber - 1);
    const int dayInCentury = dayNumber - qDiv<4>(FourCenturies * century);

    const int yearInCentury = qDiv<FourYears>(4 * dayInCentury - 1);
    const int dayInYear = dayInCentury - qDiv<4>(FourYears * yearInCentury);
    const int m = qDiv<FiveMonths>(5 * dayInYear - 3);
    Q_ASSERT(m < 12 && m >= 0);
    // That m is a month adjusted to March = 0, with Jan = 10, Feb = 11 in the previous year.
    const int yearOffset = m < 10 ? 0 : 1;

    const int y = 100 * century + yearInCentury + yearOffset;
    const int month = m + 3 - 12 * yearOffset;
    const int day = dayInYear - qDiv<5>(FiveMonths * m + 2);

    // Adjust for no year 0
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, month, day);
}